

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

RPCHelpMan * wallet::setwalletflag(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong *puVar2;
  long *plVar3;
  string name;
  string name_00;
  string m_key_name;
  string m_key_name_00;
  string m_key_name_01;
  RPCResult result;
  string description;
  string description_00;
  string description_01;
  string description_02;
  string description_03;
  Fallback fallback;
  Fallback fallback_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_00;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_01;
  vector<RPCResult,_std::allocator<RPCResult>_> inner_02;
  vector<RPCArg,_std::allocator<RPCArg>_> args;
  RPCResults results;
  RPCExamples examples;
  string description_04;
  string description_05;
  RPCArgOptions opts;
  RPCArgOptions opts_00;
  undefined1 auVar4 [32];
  pointer *ppRVar5;
  int iVar6;
  _Rb_tree_node_base *p_Var7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  long *plVar9;
  char *__lhs;
  undefined8 uVar10;
  RPCHelpMan *in_RDI;
  long lVar11;
  long in_FS_OFFSET;
  initializer_list<RPCArg> __l;
  initializer_list<RPCResult> __l_00;
  string flags;
  undefined4 in_stack_fffffffffffff628;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffff62c;
  undefined8 in_stack_fffffffffffff638;
  undefined8 in_stack_fffffffffffff640;
  undefined8 in_stack_fffffffffffff648;
  code *pcVar13;
  undefined8 in_stack_fffffffffffff650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff658;
  pointer in_stack_fffffffffffff668;
  pointer pRVar14;
  pointer in_stack_fffffffffffff670;
  pointer pRVar15;
  pointer in_stack_fffffffffffff678;
  pointer pRVar16;
  undefined8 in_stack_fffffffffffff680;
  pointer in_stack_fffffffffffff688;
  pointer pRVar17;
  pointer in_stack_fffffffffffff690;
  pointer pRVar18;
  pointer in_stack_fffffffffffff698;
  pointer pRVar19;
  undefined8 in_stack_fffffffffffff6a0;
  pointer in_stack_fffffffffffff6a8;
  pointer pRVar20;
  pointer in_stack_fffffffffffff6b0;
  pointer pRVar21;
  pointer in_stack_fffffffffffff6b8;
  pointer in_stack_fffffffffffff6c0;
  undefined1 in_stack_fffffffffffff6c8 [47];
  bool in_stack_fffffffffffff6f7;
  bool bVar22;
  _Vector_impl_data in_stack_fffffffffffff6f8;
  string local_8f0;
  string local_8d0;
  string local_8b0;
  string local_890;
  string local_870;
  string local_850;
  ulong *local_830;
  undefined8 local_828;
  ulong local_820;
  undefined8 uStack_818;
  ulong *local_810;
  size_type local_808;
  ulong local_800;
  undefined8 uStack_7f8;
  long *local_7f0 [2];
  long local_7e0 [2];
  long *local_7d0 [2];
  long local_7c0 [2];
  long *local_7b0 [2];
  long local_7a0 [2];
  vector<RPCResult,_std::allocator<RPCResult>_> local_790;
  long *local_770 [2];
  long local_760 [2];
  pointer local_750 [2];
  undefined1 local_740 [152];
  RPCResult local_6a8;
  RPCResult local_620;
  long *local_598 [2];
  long local_588 [2];
  long *local_578 [2];
  long local_568 [2];
  RPCResult local_558;
  undefined1 local_4d0;
  undefined1 *local_4c8;
  undefined8 local_4c0;
  undefined1 local_4b8;
  undefined7 uStack_4b7;
  undefined1 local_4a8 [32];
  long *local_488 [2];
  long local_478 [2];
  UniValue local_468;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_410;
  undefined1 local_3b8;
  long *local_3b0 [2];
  long local_3a0 [2];
  undefined1 local_390;
  vector<RPCArg,_std::allocator<RPCArg>_> local_388;
  undefined1 auStack_370 [8];
  undefined1 local_368 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_348;
  _Variadic_union<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  local_328;
  undefined1 local_2d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_298 [15];
  RPCArg local_1a0;
  long *local_98 [2];
  long local_88 [2];
  _Any_data local_78;
  _Manager_type local_68 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  if (WALLET_FLAG_MAP_abi_cxx11_._24_8_ != 0x6c47c8) {
    p_Var7 = (_Rb_tree_node_base *)WALLET_FLAG_MAP_abi_cxx11_._24_8_;
    do {
      if ((p_Var7[2]._M_color & _S_black) != _S_red) {
        iVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                compare(&local_58,"");
        __lhs = ", ";
        if (iVar6 == 0) {
          __lhs = "";
        }
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_2a8,__lhs,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var7 + 1));
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_58,(char *)local_2a8._M_allocated_capacity,local_2a8._8_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2a8._M_allocated_capacity != local_298) {
          operator_delete((void *)local_2a8._M_allocated_capacity,
                          local_298[0]._M_allocated_capacity + 1);
        }
      }
      p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
    } while (p_Var7 != (_Rb_tree_node_base *)(WALLET_FLAG_MAP_abi_cxx11_ + 8));
  }
  local_78._M_unused._M_object = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"setwalletflag","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_98,"\nChange the state of the given wallet flag for a wallet.\n","");
  local_2c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&local_2c8.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"flag","");
  local_328._M_first._M_storage = (_Uninitialized<RPCArg::Optional,_true>)NO;
  local_2d0 = 0;
  std::operator+(&local_348,"The name of the flag to change. Current available flags: ",&local_58);
  ppRVar5 = (pointer *)
            ((long)&local_388.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl + 0x10);
  local_390 = 0;
  local_388.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_388.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._0_1_ = 0;
  local_368._0_8_ = (pointer)0x0;
  local_368._8_2_ = 0;
  local_368._10_6_ = 0;
  local_368._16_2_ = 0;
  local_368._18_8_ = 0;
  name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff62c;
  name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff628;
  name._M_string_length = (size_type)in_RDI;
  name.field_2._M_allocated_capacity = in_stack_fffffffffffff638;
  name.field_2._8_8_ = in_stack_fffffffffffff640;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff650;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff648;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff658;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff668;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff670;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff678;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff680;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff688;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff690;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff698;
  fallback.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff6a0;
  description_04._M_string_length = (size_type)in_stack_fffffffffffff6b0;
  description_04._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6a8;
  description_04.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff6b8;
  description_04.field_2._8_8_ = in_stack_fffffffffffff6c0;
  opts.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = in_stack_fffffffffffff6f7;
  opts._0_47_ = in_stack_fffffffffffff6c8;
  opts._48_24_ = in_stack_fffffffffffff6f8;
  local_388.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)ppRVar5;
  ::RPCArg::RPCArg((RPCArg *)&local_2a8,name,(Type)&local_2c8,fallback,description_04,opts);
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"value","");
  bVar22 = true;
  UniValue::UniValue<bool,_bool,_true>(&local_468,(bool *)&stack0xfffffffffffff6f7);
  paVar1 = &local_468.val.field_2;
  local_410._8_8_ = (long)&local_410 + 0x18;
  local_410._M_first._M_storage =
       (_Uninitialized<RPCArg::Optional,_true>)(_Uninitialized<RPCArg::Optional,_true>)local_468.typ
  ;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468.val._M_dataplus._M_p == paVar1) {
    local_410._32_8_ = local_468.val.field_2._8_8_;
  }
  else {
    local_410._8_8_ = local_468.val._M_dataplus._M_p;
  }
  local_410._16_8_ = local_468.val._M_string_length;
  local_468.val._M_string_length = 0;
  local_468.val.field_2._M_local_buf[0] = '\0';
  local_410._40_8_ =
       local_468.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_410._48_8_ =
       local_468.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_410._56_8_ =
       local_468.keys.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_468.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_468.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_468.keys.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_410._64_4_ =
       local_468.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._0_4_;
  local_410._68_4_ =
       local_468.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_start._4_4_;
  local_410._72_4_ =
       local_468.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._0_4_;
  local_410._76_4_ =
       local_468.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_finish._4_4_;
  local_410._80_8_ =
       local_468.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_468.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_468.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_468.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_3b8 = 2;
  local_488[0] = local_478;
  local_468.val._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_488,"The new state.","");
  local_4c8 = &local_4b8;
  local_4d0 = 0;
  local_4c0 = 0;
  local_4b8 = 0;
  local_4a8._0_8_ = (pointer)0x0;
  local_4a8._8_2_ = 0;
  local_4a8._10_6_ = 0;
  local_4a8._16_2_ = 0;
  local_4a8._18_8_ = 0;
  name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff62c;
  name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff628;
  name_00._M_string_length = (size_type)in_RDI;
  name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff638;
  name_00.field_2._8_8_ = in_stack_fffffffffffff640;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _8_8_ = in_stack_fffffffffffff650;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _0_8_ = in_stack_fffffffffffff648;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _16_16_ = (undefined1  [16])in_stack_fffffffffffff658;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _32_8_ = in_stack_fffffffffffff668;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _40_8_ = in_stack_fffffffffffff670;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _48_8_ = in_stack_fffffffffffff678;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _56_8_ = in_stack_fffffffffffff680;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _64_8_ = in_stack_fffffffffffff688;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _72_8_ = in_stack_fffffffffffff690;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._M_u.
  _80_8_ = in_stack_fffffffffffff698;
  fallback_00.
  super__Variant_base<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  .super__Move_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_assign_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Move_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Copy_ctor_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>.
  super__Variant_storage_alias<RPCArg::Optional,_std::__cxx11::basic_string<char>,_UniValue>._88_8_
       = in_stack_fffffffffffff6a0;
  description_05._M_string_length = (size_type)in_stack_fffffffffffff6b0;
  description_05._M_dataplus._M_p = (pointer)in_stack_fffffffffffff6a8;
  description_05.field_2._M_allocated_capacity = (size_type)in_stack_fffffffffffff6b8;
  description_05.field_2._8_8_ = in_stack_fffffffffffff6c0;
  opts_00.type_str.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._7_1_ = bVar22;
  opts_00._0_47_ = in_stack_fffffffffffff6c8;
  opts_00._48_24_ = in_stack_fffffffffffff6f8;
  ::RPCArg::RPCArg(&local_1a0,name_00,(Type)local_3b0,fallback_00,description_05,opts_00);
  __l._M_len = 2;
  __l._M_array = (iterator)&local_2a8;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff6f8,__l,
             (allocator_type *)&stack0xfffffffffffff6f6);
  local_578[0] = local_568;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_578,"");
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_598,"");
  local_750[0] = (pointer)local_740;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_750,"flag_name","");
  local_770[0] = local_760;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_770,"The name of the flag that was modified","");
  pRVar20 = (pointer)0x0;
  pRVar21 = (pointer)0x0;
  m_key_name._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff62c;
  m_key_name._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff628;
  m_key_name._M_string_length = (size_type)in_RDI;
  m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff638;
  m_key_name.field_2._8_8_ = in_stack_fffffffffffff640;
  description._M_string_length = in_stack_fffffffffffff650;
  description._M_dataplus._M_p = (pointer)in_stack_fffffffffffff648;
  description.field_2 = in_stack_fffffffffffff658;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_finish = in_stack_fffffffffffff670;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_start = in_stack_fffffffffffff668;
  inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = in_stack_fffffffffffff678;
  ::RPCResult::RPCResult
            ((RPCResult *)(local_740 + 0x10),STR,m_key_name,description,inner,SUB81(local_750,0));
  local_790.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((long)&local_790.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl
                + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_790,"flag_state","");
  local_7b0[0] = local_7a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7b0,"The new state of the flag","");
  pRVar17 = (pointer)0x0;
  pRVar18 = (pointer)0x0;
  pRVar19 = (pointer)0x0;
  m_key_name_00._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff62c;
  m_key_name_00._M_dataplus._M_p._0_4_ = in_stack_fffffffffffff628;
  m_key_name_00._M_string_length = (size_type)in_RDI;
  m_key_name_00.field_2._M_allocated_capacity = in_stack_fffffffffffff638;
  m_key_name_00.field_2._8_8_ = in_stack_fffffffffffff640;
  description_00._M_string_length = in_stack_fffffffffffff650;
  description_00._M_dataplus._M_p = (pointer)in_stack_fffffffffffff648;
  description_00.field_2 = in_stack_fffffffffffff658;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = in_stack_fffffffffffff670;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = in_stack_fffffffffffff668;
  inner_00.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = in_stack_fffffffffffff678;
  ::RPCResult::RPCResult(&local_6a8,BOOL,m_key_name_00,description_00,inner_00,SUB81(&local_790,0));
  local_7d0[0] = local_7c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_7d0,"warnings","");
  local_7f0[0] = local_7e0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_7f0,"Any warnings associated with the change","");
  pRVar14 = (pointer)0x0;
  pRVar15 = (pointer)0x0;
  pRVar16 = (pointer)0x0;
  uVar12 = 0;
  auVar4._4_8_ = in_RDI;
  auVar4._0_4_ = in_stack_fffffffffffff62c;
  auVar4._12_8_ = in_stack_fffffffffffff638;
  auVar4._20_8_ = in_stack_fffffffffffff640;
  auVar4._28_4_ = 0;
  description_01._M_string_length = in_stack_fffffffffffff650;
  description_01._M_dataplus._M_p = (pointer)in_stack_fffffffffffff648;
  description_01.field_2._M_local_buf = in_stack_fffffffffffff658._M_local_buf;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  inner_01.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  ::RPCResult::RPCResult
            (&local_620,STR,(string)(auVar4 << 0x20),SUB81(local_7d0,0),description_01,inner_01,true
            );
  __l_00._M_len = 3;
  __l_00._M_array = (iterator)(local_740 + 0x10);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff6c0,__l_00,
             (allocator_type *)&stack0xfffffffffffff667);
  m_key_name_01._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff62c;
  m_key_name_01._M_dataplus._M_p._0_4_ = uVar12;
  m_key_name_01._M_string_length = (size_type)in_RDI;
  m_key_name_01.field_2._M_allocated_capacity = in_stack_fffffffffffff638;
  m_key_name_01.field_2._8_8_ = in_stack_fffffffffffff640;
  description_02._M_string_length = in_stack_fffffffffffff650;
  description_02._M_dataplus._M_p = (pointer)in_stack_fffffffffffff648;
  description_02.field_2 = in_stack_fffffffffffff658;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_finish = pRVar15;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_start = pRVar14;
  inner_02.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)pRVar16;
  ::RPCResult::RPCResult(&local_558,OBJ,m_key_name_01,description_02,inner_02,SUB81(local_578,0));
  result._4_4_ = in_stack_fffffffffffff62c;
  result.m_type = uVar12;
  result.m_key_name._M_dataplus._M_p = (pointer)in_RDI;
  result.m_key_name._M_string_length = in_stack_fffffffffffff638;
  result.m_key_name.field_2._M_allocated_capacity = in_stack_fffffffffffff640;
  result.m_key_name.field_2._8_8_ = in_stack_fffffffffffff648;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff650;
  result.m_inner.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._8_16_ = in_stack_fffffffffffff658;
  result._64_8_ = pRVar14;
  result.m_description._M_dataplus._M_p = (pointer)pRVar15;
  result.m_description._M_string_length = (size_type)pRVar16;
  result.m_description.field_2._M_allocated_capacity = in_stack_fffffffffffff680;
  result.m_description.field_2._8_8_ = pRVar17;
  result.m_cond._M_dataplus._M_p = (pointer)pRVar18;
  result.m_cond._M_string_length = (size_type)pRVar19;
  result.m_cond.field_2._M_allocated_capacity = in_stack_fffffffffffff6a0;
  result.m_cond.field_2._8_8_ = pRVar20;
  RPCResults::RPCResults((RPCResults *)&stack0xfffffffffffff6d8,result);
  local_870._M_dataplus._M_p = (pointer)&local_870.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_870,"setwalletflag","");
  local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"avoid_reuse","");
  HelpExampleCli(&local_850,&local_870,&local_890);
  local_8d0._M_dataplus._M_p = (pointer)&local_8d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8d0,"setwalletflag","");
  local_8f0._M_dataplus._M_p = (pointer)&local_8f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8f0,"\"avoid_reuse\"","");
  HelpExampleRpc(&local_8b0,&local_8d0,&local_8f0);
  uVar10 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    uVar10 = local_850.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar10 < local_8b0._M_string_length + local_850._M_string_length) {
    uVar10 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
      uVar10 = local_8b0.field_2._M_allocated_capacity;
    }
    if (local_8b0._M_string_length + local_850._M_string_length <= (ulong)uVar10) {
      pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               replace(&local_8b0,0,0,local_850._M_dataplus._M_p,local_850._M_string_length);
      goto LAB_001fea18;
    }
  }
  pbVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_850,local_8b0._M_dataplus._M_p,local_8b0._M_string_length);
LAB_001fea18:
  local_830 = &local_820;
  puVar2 = (ulong *)(pbVar8->_M_dataplus)._M_p;
  paVar1 = &pbVar8->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar2 == paVar1) {
    local_820 = paVar1->_M_allocated_capacity;
    uStack_818 = *(undefined8 *)((long)&pbVar8->field_2 + 8);
  }
  else {
    local_820 = paVar1->_M_allocated_capacity;
    local_830 = puVar2;
  }
  local_808 = pbVar8->_M_string_length;
  (pbVar8->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar8->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_830 == &local_820) {
    uStack_7f8 = uStack_818;
    local_810 = &local_800;
  }
  else {
    local_810 = local_830;
  }
  local_800 = local_820;
  local_828 = 0;
  local_820 = local_820 & 0xffffffffffffff00;
  pcVar13 = std::
            _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:298:9)>
            ::_M_manager;
  description_03._M_string_length =
       (size_type)
       std::
       _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:298:9)>
       ::_M_invoke;
  description_03._M_dataplus._M_p =
       (pointer)std::
                _Function_handler<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/rpc/wallet.cpp:298:9)>
                ::_M_manager;
  description_03.field_2 = in_stack_fffffffffffff658;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)pRVar15;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)pRVar14;
  args.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pRVar16;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_finish = pRVar17;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffff680;
  results.m_results.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = pRVar18;
  examples.m_examples._M_string_length = in_stack_fffffffffffff6a0;
  examples.m_examples._M_dataplus._M_p = (pointer)pRVar19;
  examples.m_examples.field_2._M_allocated_capacity = (size_type)pRVar20;
  examples.m_examples.field_2._8_8_ = pRVar21;
  local_830 = &local_820;
  RPCHelpMan::RPCHelpMan
            (in_RDI,(string)ZEXT1632(CONCAT88(in_RDI,&stack0xfffffffffffff638)),description_03,args,
             results,examples,(RPCMethodImpl *)&local_78);
  if (pcVar13 != (code *)0x0) {
    (*pcVar13)(&stack0xfffffffffffff638,&stack0xfffffffffffff638,3);
  }
  if (local_810 != &local_800) {
    operator_delete(local_810,local_800 + 1);
  }
  if (local_830 != &local_820) {
    operator_delete(local_830,local_820 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8b0._M_dataplus._M_p != &local_8b0.field_2) {
    operator_delete(local_8b0._M_dataplus._M_p,local_8b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8f0._M_dataplus._M_p != &local_8f0.field_2) {
    operator_delete(local_8f0._M_dataplus._M_p,local_8f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8d0._M_dataplus._M_p != &local_8d0.field_2) {
    operator_delete(local_8d0._M_dataplus._M_p,local_8d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_850._M_dataplus._M_p != &local_850.field_2) {
    operator_delete(local_850._M_dataplus._M_p,local_850.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_890._M_dataplus._M_p != &local_890.field_2) {
    operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_870._M_dataplus._M_p != &local_870.field_2) {
    operator_delete(local_870._M_dataplus._M_p,local_870.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff6d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558.m_cond._M_dataplus._M_p != &local_558.m_cond.field_2) {
    operator_delete(local_558.m_cond._M_dataplus._M_p,
                    local_558.m_cond.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558.m_description._M_dataplus._M_p != &local_558.m_description.field_2) {
    operator_delete(local_558.m_description._M_dataplus._M_p,
                    local_558.m_description.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector(&local_558.m_inner);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558.m_key_name._M_dataplus._M_p != &local_558.m_key_name.field_2) {
    operator_delete(local_558.m_key_name._M_dataplus._M_p,
                    local_558.m_key_name.field_2._M_allocated_capacity + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff6c0);
  lVar11 = 0x198;
  do {
    if ((long *)(local_740 + lVar11) != *(long **)((long)local_750 + lVar11)) {
      operator_delete(*(long **)((long)local_750 + lVar11),*(long *)(local_740 + lVar11) + 1);
    }
    if ((long *)((long)local_760 + lVar11) != *(long **)((long)local_770 + lVar11)) {
      operator_delete(*(long **)((long)local_770 + lVar11),*(long *)((long)local_760 + lVar11) + 1);
    }
    std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
              ((vector<RPCResult,_std::allocator<RPCResult>_> *)
               ((long)&local_790.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               lVar11));
    if ((long *)((long)local_7a0 + lVar11) != *(long **)((long)local_7b0 + lVar11)) {
      operator_delete(*(long **)((long)local_7b0 + lVar11),*(long *)((long)local_7a0 + lVar11) + 1);
    }
    lVar11 = lVar11 + -0x88;
  } while (lVar11 != 0);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff668);
  if (local_7f0[0] != local_7e0) {
    operator_delete(local_7f0[0],local_7e0[0] + 1);
  }
  if (local_7d0[0] != local_7c0) {
    operator_delete(local_7d0[0],local_7c0[0] + 1);
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff688);
  if (local_7b0[0] != local_7a0) {
    operator_delete(local_7b0[0],local_7a0[0] + 1);
  }
  if (local_790.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
      super__Vector_impl_data._M_start !=
      (pointer)((long)&local_790.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl +
               0x10U)) {
    operator_delete(local_790.super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)&(local_790.
                                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage)->m_type + 1))
    ;
  }
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)&stack0xfffffffffffff6a8);
  if (local_770[0] != local_760) {
    operator_delete(local_770[0],local_760[0] + 1);
  }
  if (local_750[0] != (pointer)local_740) {
    operator_delete(local_750[0],local_740._0_8_ + 1);
  }
  if (local_598[0] != local_588) {
    operator_delete(local_598[0],local_588[0] + 1);
  }
  if (local_578[0] != local_568) {
    operator_delete(local_578[0],local_568[0] + 1);
  }
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)&stack0xfffffffffffff6f8);
  lVar11 = 0x210;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&local_2c8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl + lVar11));
    plVar3 = *(long **)((long)&local_328 + lVar11 + 0x40);
    plVar9 = (long *)((long)&local_328 + lVar11 + 0x50);
    if (plVar9 != plVar3) {
      operator_delete(plVar3,*plVar9 + 1);
    }
    plVar9 = (long *)((long)&local_328 + lVar11 + 0x28);
    plVar3 = *(long **)((long)&local_328 + lVar11 + 0x18);
    if (plVar9 != plVar3) {
      operator_delete(plVar3,*plVar9 + 1);
    }
    std::__detail::__variant::
    _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                         *)(auStack_370 + lVar11));
    std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
              ((vector<RPCArg,_std::allocator<RPCArg>_> *)
               ((long)&local_388.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl +
               lVar11));
    if ((long *)((long)local_3a0 + lVar11) != *(long **)((long)local_3b0 + lVar11)) {
      operator_delete(*(long **)((long)local_3b0 + lVar11),*(long *)((long)local_3a0 + lVar11) + 1);
    }
    lVar11 = lVar11 + -0x108;
  } while (lVar11 != 0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_4a8);
  if (local_4c8 != &local_4b8) {
    operator_delete(local_4c8,CONCAT71(uStack_4b7,local_4b8) + 1);
  }
  if (local_488[0] != local_478) {
    operator_delete(local_488[0],local_478[0] + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_410._M_first);
  std::vector<UniValue,_std::allocator<UniValue>_>::~vector(&local_468.values);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_468.keys);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_468.val._M_dataplus._M_p != &local_468.val.field_2) {
    operator_delete(local_468.val._M_dataplus._M_p,
                    CONCAT71(local_468.val.field_2._M_allocated_capacity._1_7_,
                             local_468.val.field_2._M_local_buf[0]) + 1);
  }
  if (local_3b0[0] != local_3a0) {
    operator_delete(local_3b0[0],local_3a0[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_368);
  if (local_388.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)ppRVar5) {
    operator_delete(local_388.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    CONCAT71(local_388.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._1_7_,
                             local_388.super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage._0_1_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  std::__detail::__variant::
  _Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~_Variant_storage((_Variant_storage<false,_RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
                       *)&local_328._M_first);
  if (local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pointer)((long)&local_2c8.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl + 0x10U)) {
    operator_delete(local_2c8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (ulong)((long)&((local_2c8.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                   _M_dataplus)._M_p + 1));
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((_Manager_type *)local_78._M_unused._0_8_ != local_68) {
    operator_delete(local_78._M_unused._M_object,(ulong)(local_68[0] + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,
                    CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                             local_58.field_2._M_local_buf[0]) + 1);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan setwalletflag()
{
            std::string flags;
            for (auto& it : WALLET_FLAG_MAP)
                if (it.second & MUTABLE_WALLET_FLAGS)
                    flags += (flags == "" ? "" : ", ") + it.first;

    return RPCHelpMan{"setwalletflag",
                "\nChange the state of the given wallet flag for a wallet.\n",
                {
                    {"flag", RPCArg::Type::STR, RPCArg::Optional::NO, "The name of the flag to change. Current available flags: " + flags},
                    {"value", RPCArg::Type::BOOL, RPCArg::Default{true}, "The new state."},
                },
                RPCResult{
                    RPCResult::Type::OBJ, "", "",
                    {
                        {RPCResult::Type::STR, "flag_name", "The name of the flag that was modified"},
                        {RPCResult::Type::BOOL, "flag_state", "The new state of the flag"},
                        {RPCResult::Type::STR, "warnings", /*optional=*/true, "Any warnings associated with the change"},
                    }
                },
                RPCExamples{
                    HelpExampleCli("setwalletflag", "avoid_reuse")
                  + HelpExampleRpc("setwalletflag", "\"avoid_reuse\"")
                },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
{
    std::shared_ptr<CWallet> const pwallet = GetWalletForJSONRPCRequest(request);
    if (!pwallet) return UniValue::VNULL;

    std::string flag_str = request.params[0].get_str();
    bool value = request.params[1].isNull() || request.params[1].get_bool();

    if (!WALLET_FLAG_MAP.count(flag_str)) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Unknown wallet flag: %s", flag_str));
    }

    auto flag = WALLET_FLAG_MAP.at(flag_str);

    if (!(flag & MUTABLE_WALLET_FLAGS)) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Wallet flag is immutable: %s", flag_str));
    }

    UniValue res(UniValue::VOBJ);

    if (pwallet->IsWalletFlagSet(flag) == value) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, strprintf("Wallet flag is already set to %s: %s", value ? "true" : "false", flag_str));
    }

    res.pushKV("flag_name", flag_str);
    res.pushKV("flag_state", value);

    if (value) {
        pwallet->SetWalletFlag(flag);
    } else {
        pwallet->UnsetWalletFlag(flag);
    }

    if (flag && value && WALLET_FLAG_CAVEATS.count(flag)) {
        res.pushKV("warnings", WALLET_FLAG_CAVEATS.at(flag));
    }

    return res;
},
    };
}